

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,BlockNode *node)

{
  bool bVar1;
  ostream *poVar2;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *this_00;
  pointer pSVar3;
  BlockNode *in_RSI;
  ostream *in_RDI;
  unique_ptr<StatementNode,_std::default_delete<StatementNode>_> *statement;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *__range1;
  PrintVisitor visitor;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  uint indentation;
  PrintVisitor *this_01;
  PrintVisitor *in_stack_ffffffffffffff88;
  _Self local_70;
  _Self local_68;
  list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
  *local_60;
  undefined1 local_58 [40];
  string local_30 [32];
  BlockNode *local_10;
  
  indentation = (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  this_01 = *(PrintVisitor **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_ffffffffffffff88);
  poVar2 = std::operator<<((ostream *)this_01,local_30);
  std::operator<<(poVar2,"BlockNode:\n");
  std::__cxx11::string::~string(local_30);
  PrintVisitor(this_01,in_RDI,indentation);
  this_00 = BlockNode::getStatements_abi_cxx11_(local_10);
  local_60 = this_00;
  local_68._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>,_std::allocator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>_>
       ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    std::_List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
    ::operator*((_List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
                 *)this_00);
    pSVar3 = std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>::operator->
                       ((unique_ptr<StatementNode,_std::default_delete<StatementNode>_> *)0x1679b1);
    (*(pSVar3->super_Node)._vptr_Node[2])(pSVar3,local_58);
    std::_List_const_iterator<std::unique_ptr<StatementNode,_std::default_delete<StatementNode>_>_>
    ::operator++(&local_68);
  }
  ~PrintVisitor((PrintVisitor *)0x167a10);
  return;
}

Assistant:

void PrintVisitor::visit(const BlockNode& node)
{
  stream_ << indent() << "BlockNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& statement : node.getStatements())
  {
    statement->accept(visitor);
  }
}